

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_info.c
# Opt level: O2

void info_print_must(lyout *out,lys_restr *must,uint8_t must_size)

{
  undefined7 in_register_00000011;
  long lVar1;
  
  ly_print(out,"%-*s",0xb,"Must: ");
  if ((int)CONCAT71(in_register_00000011,must_size) != 0) {
    ly_print(out,"%s\n",must->expr);
    for (lVar1 = 0x38; (ulong)must_size * 0x38 - lVar1 != 0; lVar1 = lVar1 + 0x38) {
      ly_print(out,"%*s%s\n",0xb,"",*(undefined8 *)((long)&must->expr + lVar1));
    }
    return;
  }
  ly_print(out,"\n");
  return;
}

Assistant:

static void
info_print_must(struct lyout *out, const struct lys_restr *must, uint8_t must_size)
{
    int i;

    ly_print(out, "%-*s", INDENT_LEN, "Must: ");

    if (must_size) {
        ly_print(out, "%s\n", must[0].expr);
        for (i = 1; i < must_size; ++i) {
            ly_print(out, "%*s%s\n", INDENT_LEN, "", must[i].expr);
        }
    } else {
        ly_print(out, "\n");
    }
}